

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Semaphore.h
# Opt level: O0

__sighandler_t __thiscall
axl::sys::NamedSemaphore::signal(NamedSemaphore *this,int __sig,__sighandler_t __handler)

{
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  bool result;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  NamedSemaphore *local_18;
  undefined1 local_1;
  
  local_18 = (NamedSemaphore *)CONCAT44(in_register_00000034,__sig);
  do {
    if (local_18 == (NamedSemaphore *)0x0) {
      local_1 = 1;
LAB_0014abf3:
      return (__sighandler_t)CONCAT71((int7)((ulong)this >> 8),local_1);
    }
    in_stack_ffffffffffffffe7 =
         psx::NamedSem::post((NamedSem *)
                             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    this = (NamedSemaphore *)CONCAT71(extraout_var,in_stack_ffffffffffffffe7);
    if (!(bool)in_stack_ffffffffffffffe7) {
      local_1 = 0;
      goto LAB_0014abf3;
    }
    this = (NamedSemaphore *)
           ((long)&local_18[-1].m_sem.
                   super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h
           + 7);
    local_18 = this;
  } while( true );
}

Assistant:

bool
	signal(size_t count) {
		for (; count; count--) {
			bool result = m_sem.post();
			if (!result)
				return false;
		}

		return true;
	}